

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

App * __thiscall CLI::App::get_subcommand(App *this,App *subcom)

{
  App *pAVar1;
  OptionNotFound *pOVar2;
  pointer psVar3;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  if (subcom == (App *)0x0) {
    pOVar2 = (OptionNotFound *)__cxa_allocate_exception(0x38);
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"nullptr passed",&local_59);
    OptionNotFound::OptionNotFound(pOVar2,&local_38);
    __cxa_throw(pOVar2,&OptionNotFound::typeinfo,Error::~Error);
  }
  psVar3 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (psVar3 == (this->subcommands_).
                  super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      pOVar2 = (OptionNotFound *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string((string *)&local_58,(string *)&subcom->name_);
      OptionNotFound::OptionNotFound(pOVar2,&local_58);
      __cxa_throw(pOVar2,&OptionNotFound::typeinfo,Error::~Error);
    }
    pAVar1 = (psVar3->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    psVar3 = psVar3 + 1;
  } while (pAVar1 != subcom);
  return pAVar1;
}

Assistant:

App *get_subcommand(const App *subcom) const {
        if(subcom == nullptr)
            throw OptionNotFound("nullptr passed");
        for(const App_p &subcomptr : subcommands_)
            if(subcomptr.get() == subcom)
                return subcomptr.get();
        throw OptionNotFound(subcom->get_name());
    }